

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

void __thiscall lzham::lzham_decompressor::reset_huff_tables(lzham_decompressor *this)

{
  quasi_adaptive_huffman_data_model::reset(&this->m_lit_table);
  quasi_adaptive_huffman_data_model::reset(&this->m_delta_lit_table);
  quasi_adaptive_huffman_data_model::reset(&this->m_main_table);
  quasi_adaptive_huffman_data_model::reset((quasi_adaptive_huffman_data_model *)&this->field_0x318);
  quasi_adaptive_huffman_data_model::reset((quasi_adaptive_huffman_data_model *)&this->field_0x3a8);
  quasi_adaptive_huffman_data_model::reset((quasi_adaptive_huffman_data_model *)&this->field_0x438);
  quasi_adaptive_huffman_data_model::reset((quasi_adaptive_huffman_data_model *)&this->field_0x4c8);
  quasi_adaptive_huffman_data_model::reset(&this->m_dist_lsb_table);
  return;
}

Assistant:

void lzham_decompressor::reset_huff_tables()
   {
      m_lit_table.reset();
     m_delta_lit_table.reset();
      
      m_main_table.reset();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_rep_len_table); i++)
         m_rep_len_table[i].reset();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_large_len_table); i++)
         m_large_len_table[i].reset();

      m_dist_lsb_table.reset();
   }